

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_NurbsSurface::IsValid(ON_NurbsSurface *this,ON_TextLog *text_log)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  
  uVar10 = (ulong)(uint)this->m_dim;
  if (this->m_dim < 1) {
    if (text_log != (ON_TextLog *)0x0) {
      pcVar7 = "ON_NurbsSurface.m_dim = %d (should be > 0).\n";
      goto LAB_005439e8;
    }
  }
  else {
    if (this->m_cv == (double *)0x0) {
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      pcVar7 = "ON_NurbsSurface.m_cv is nullptr.\n";
LAB_005439e8:
      ON_TextLog::Print(text_log,pcVar7,uVar10);
      return false;
    }
    bVar3 = 1;
    uVar10 = 0;
    do {
      uVar6 = this->m_order[uVar10];
      if ((int)uVar6 < 2) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        pcVar7 = "ON_NurbsSurface.m_order[i] = %d (should be >= 2).\n";
        goto LAB_00543a0f;
      }
      uVar1 = this->m_cv_count[uVar10];
      if ((int)uVar1 < (int)uVar6) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,
                          "ON_NurbsSurface.m_cv_count[%d] = %d (should be >= m_order[%d]=%d).\n",
                          uVar10,(ulong)uVar1,uVar10);
        return false;
      }
      if (this->m_knot[uVar10] == (double *)0x0) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        ON_TextLog::Print(text_log,"ON_NurbsSurface.m_knot[i] is nullptr.\n");
        return false;
      }
      bVar4 = ON_IsValidKnotVector(uVar6,uVar1,this->m_knot[uVar10],text_log);
      if (!bVar4) {
        if (text_log == (ON_TextLog *)0x0) {
          return false;
        }
        pcVar7 = "ON_NurbsSurface.m_knot[%d] is not a valid knot vector.\n";
        goto LAB_005439e8;
      }
      iVar8 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
      iVar5 = this->m_cv_stride[uVar10];
      bVar4 = iVar8 <= iVar5;
      if (text_log != (ON_TextLog *)0x0 && !bVar4) {
        ON_TextLog::Print(text_log,
                          "ON_NurbsSurface.m_cv_stride[%d]=%d is too small (should be >= %d).\n",
                          uVar10);
        return false;
      }
      uVar10 = 1;
      bVar2 = (bool)(bVar3 & iVar8 <= iVar5);
      bVar3 = 0;
    } while (bVar2);
    if (iVar5 < iVar8) {
      return bVar4;
    }
    iVar5 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
    uVar1 = this->m_cv_stride[0];
    uVar10 = (ulong)uVar1;
    if ((int)uVar1 < iVar5) {
      uVar6 = this->m_cv_stride[1];
    }
    else {
      uVar9 = this->m_cv_count[0];
      uVar6 = this->m_cv_stride[1];
      if ((int)(uVar9 * iVar5) <= (int)uVar6) goto LAB_00543add;
    }
    if (iVar5 <= (int)uVar6 && this->m_cv_count[1] * iVar5 <= (int)uVar1) {
      uVar9 = this->m_cv_count[0];
LAB_00543add:
      if ((int)uVar9 < 1) {
        return bVar4;
      }
      uVar6 = (this->m_dim + 1) - (uint)(this->m_is_rat == 0);
      uVar10 = 0;
      do {
        if (0 < this->m_cv_count[1]) {
          uVar12 = 0;
          do {
            lVar13 = uVar12 * (long)this->m_cv_stride[1] + uVar10 * (long)this->m_cv_stride[0];
            pdVar14 = this->m_cv + lVar13;
            if (lVar13 < 0) {
              pdVar14 = (double *)0x0;
            }
            if (this->m_cv == (double *)0x0) {
              pdVar14 = (double *)0x0;
            }
            if (0 < (int)uVar6) {
              uVar11 = 0;
              do {
                if (1e+307 <= ABS(pdVar14[uVar11])) {
                  return false;
                }
                uVar11 = uVar11 + 1;
              } while (uVar6 != uVar11);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != (uint)this->m_cv_count[1]);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar9);
      return bVar4;
    }
    if (text_log != (ON_TextLog *)0x0) {
      pcVar7 = "ON_NurbsSurface.m_cv_stride[] = {%d,%d} is not valid.\n";
LAB_00543a0f:
      ON_TextLog::Print(text_log,pcVar7,uVar10,(ulong)uVar6);
      return false;
    }
  }
  return false;
}

Assistant:

bool ON_NurbsSurface::IsValid( ON_TextLog* text_log ) const
{
  bool rc = false;

  if ( m_dim <= 0 )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsSurface.m_dim = %d (should be > 0).\n",m_dim);
    }
  }
  else if ( m_cv == nullptr )
  {
    if ( text_log )
    {
      text_log->Print("ON_NurbsSurface.m_cv is nullptr.\n",m_dim);
    }
  }
  else
  {
    rc = true;
    for ( int i = 0; i < 2 && rc; i++ )
    {
      rc = false;
      if (m_order[i] < 2 )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_order[i] = %d (should be >= 2).\n",i,m_order[i]);
        }
      }
      else if (m_cv_count[i] < m_order[i] )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_cv_count[%d] = %d (should be >= m_order[%d]=%d).\n",i,m_cv_count[i],i,m_order[i]);
        }
      }
      else if (m_knot[i] == nullptr)
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_knot[i] is nullptr.\n");
        }
      }
      else if ( !ON_IsValidKnotVector( m_order[i], m_cv_count[i], m_knot[i], text_log ) )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_knot[%d] is not a valid knot vector.\n",i);
        }
      }
      else if ( m_cv_stride[i] < CVSize() )
      {
        if ( text_log )
        {
          text_log->Print("ON_NurbsSurface.m_cv_stride[%d]=%d is too small (should be >= %d).\n",i,m_cv_stride[i],CVSize());
        }
      }
      else
        rc = true;
    }
    if ( rc )
    {
      int a0 = CVSize();
      int a1 = m_cv_count[0]*a0;
      int b1 = CVSize();
      int b0 = m_cv_count[1]*b1;
      if ( m_cv_stride[0] < a0 || m_cv_stride[1] < a1 )
      {
        if ( m_cv_stride[0] < b0 || m_cv_stride[1] < b1 )
        {
          if ( text_log )
          {
            text_log->Print("ON_NurbsSurface.m_cv_stride[] = {%d,%d} is not valid.\n",m_cv_stride[0],m_cv_stride[1]);
          }
          rc = false;
        }
      }
    }

    if (rc)
    {
      const int cvdim = CVSize();
      for (int i = 0; m_cv_count[0] > i; ++i)
      {
        for (int j = 0; m_cv_count[1] > j; ++j)
        {
          const double* cv = CV(i, j);
          for (int k = 0; cvdim > k; ++k)
          {
            if (false == ON_CV_COORDINATE_IS_VALID(cv[k]))
              return false;
          }
        }
      }
    }
  }

  return rc;
}